

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O0

ActionMessage * __thiscall helics::ipc::OwnedQueue::getMessage(OwnedQueue *this)

{
  bool bVar1;
  ActionMessage *this_00;
  ostream *this_01;
  size_type in_RSI;
  ActionMessage *in_RDI;
  message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_> *unaff_retaddr;
  uint priority;
  size_t rx_size;
  ActionMessage *cmd;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  size_type *recvd_size;
  ActionMessage *buffer;
  
  if ((*(byte *)(in_RSI + 0xac) & 1) == 0) {
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (action_t)(in_RSI >> 0x20));
  }
  else {
    recvd_size = (size_type *)0x0;
    uVar2 = 0;
    buffer = in_RDI;
    do {
      do {
        this_00 = (ActionMessage *)
                  std::
                  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                  ::operator->((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                                *)0x3cb8ad);
        std::vector<char,_std::allocator<char>_>::data
                  ((vector<char,_std::allocator<char>_> *)0x3cb8c3);
        boost::interprocess::
        message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::receive
                  (unaff_retaddr,buffer,in_RSI,recvd_size,
                   (uint *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
      } while (recvd_size < (size_type *)0x8);
      in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 & 0xffffff;
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x3cb906);
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd8,
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      bVar1 = isValidCommand((ActionMessage *)0x3cb922);
      if (bVar1) {
        in_stack_ffffffffffffffe0 = CONCAT13(1,(int3)in_stack_ffffffffffffffe0);
        in_stack_ffffffffffffffd0 = 1;
      }
      else {
        this_01 = std::operator<<((ostream *)&std::cerr,"invalid command received ipc");
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        in_stack_ffffffffffffffd0 = 2;
      }
      if ((in_stack_ffffffffffffffe0 & 0x1000000) == 0) {
        ActionMessage::~ActionMessage(this_00);
      }
    } while (in_stack_ffffffffffffffd0 != 1);
  }
  return in_RDI;
}

Assistant:

ActionMessage OwnedQueue::getMessage()
    {
        if (!connected) {
            return (CMD_ERROR);
        }
        size_t rx_size = 0;
        unsigned int priority{0};
        while (true) {
            rqueue->receive(buffer.data(), mxSize, rx_size, priority);
            if (rx_size < 8) {
                continue;
            }
            ActionMessage cmd(reinterpret_cast<std::byte*>(buffer.data()), rx_size);
            if (!isValidCommand(cmd)) {
                std::cerr << "invalid command received ipc" << std::endl;
                continue;
            }
            return cmd;
        }
    }